

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintMessageEnd_abi_cxx11_
          (string *__return_storage_ptr__,FieldValuePrinter *this,Message *message,int field_index,
          int field_count,bool single_line_mode)

{
  char *pcVar1;
  undefined3 in_register_00000089;
  StringBaseTextGenerator generator;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  local_30 = 0;
  local_28[0] = 0;
  pcVar1 = "$0  }\n";
  if (CONCAT31(in_register_00000089,single_line_mode) != 0) {
    pcVar1 = "} {z} ";
  }
  local_38 = local_28;
  std::__cxx11::string::append((char *)&local_38,(ulong)(pcVar1 + 4));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_38,local_38 + local_30);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TextFormat::FieldValuePrinter::PrintMessageEnd(
    const Message& message, int field_index, int field_count,
    bool single_line_mode) const {
  FORWARD_IMPL(PrintMessageEnd, message, field_index, field_count,
               single_line_mode);
}